

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::VerifySignatureTxInRequest::ConvertFromStruct
          (VerifySignatureTxInRequest *this,VerifySignatureTxInRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  std::__cxx11::string::_M_assign((string *)&this->signature_);
  std::__cxx11::string::_M_assign((string *)&this->pubkey_);
  std::__cxx11::string::_M_assign((string *)&this->redeem_script_);
  std::__cxx11::string::_M_assign((string *)&this->hash_type_);
  std::__cxx11::string::_M_assign((string *)&this->sighash_type_);
  this->sighash_anyone_can_pay_ = data->sighash_anyone_can_pay;
  this->sighash_rangeproof_ = data->sighash_rangeproof;
  this->amount_ = data->amount;
  std::__cxx11::string::_M_assign((string *)&this->confidential_value_commitment_);
  std::__cxx11::string::_M_assign((string *)&this->annex_);
  this->code_separator_position_ = data->code_separator_position;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void VerifySignatureTxInRequest::ConvertFromStruct(
    const VerifySignatureTxInRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  signature_ = data.signature;
  pubkey_ = data.pubkey;
  redeem_script_ = data.redeem_script;
  hash_type_ = data.hash_type;
  sighash_type_ = data.sighash_type;
  sighash_anyone_can_pay_ = data.sighash_anyone_can_pay;
  sighash_rangeproof_ = data.sighash_rangeproof;
  amount_ = data.amount;
  confidential_value_commitment_ = data.confidential_value_commitment;
  annex_ = data.annex;
  code_separator_position_ = data.code_separator_position;
  ignore_items = data.ignore_items;
}